

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  long in_RCX;
  uchar *in_RDX;
  long in_RSI;
  long in_RDI;
  secp256k1_scalar m;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  secp256k1_scalar *in_stack_00000120;
  secp256k1_ge *in_stack_00000128;
  secp256k1_scalar *in_stack_00000130;
  secp256k1_scalar *in_stack_00000138;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  secp256k1_scalar in_stack_ffffffffffffff64;
  secp256k1_scalar *in_stack_ffffffffffffff68;
  secp256k1_context *in_stack_ffffffffffffff70;
  secp256k1_pubkey *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  uint local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
            ,0x1d5,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RDX == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)&stack0xffffffffffffff64,in_RDX,(int *)0x0);
    secp256k1_ecdsa_signature_load
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)&stack0xffffffffffffff68);
    local_4 = 0;
    if (iVar1 == 0) {
      iVar1 = secp256k1_pubkey_load
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98);
      local_4 = 0;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_sig_verify
                          (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
        local_4 = (uint)(iVar1 != 0) << 0x18;
      }
    }
    local_4 = local_4 >> 0x18;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}